

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O3

Curl_addrinfo * Curl_he2ai(hostent *he,int port)

{
  int iVar1;
  undefined8 uVar2;
  Curl_addrinfo *pCVar3;
  char *pcVar4;
  sockaddr *psVar5;
  Curl_addrinfo *pCVar6;
  curl_socklen_t cVar7;
  long lVar8;
  Curl_addrinfo *pCVar9;
  char *local_38;
  
  if ((he != (hostent *)0x0) && (local_38 = *he->h_addr_list, local_38 != (char *)0x0)) {
    iVar1 = he->h_addrtype;
    lVar8 = 8;
    pCVar6 = (Curl_addrinfo *)0x0;
    pCVar9 = (Curl_addrinfo *)0x0;
    while( true ) {
      cVar7 = 0x10;
      if (iVar1 == 10) {
        cVar7 = 0x1c;
      }
      pCVar3 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
      if (pCVar3 == (Curl_addrinfo *)0x0) goto joined_r0x0013a65f;
      pcVar4 = (*Curl_cstrdup)(he->h_name);
      pCVar3->ai_canonname = pcVar4;
      if (pcVar4 == (char *)0x0) break;
      psVar5 = (sockaddr *)(*Curl_ccalloc)(1,(size_t)cVar7);
      pCVar3->ai_addr = psVar5;
      if (psVar5 == (sockaddr *)0x0) {
        (*Curl_cfree)(pCVar3->ai_canonname);
        break;
      }
      if (pCVar6 == (Curl_addrinfo *)0x0) {
        pCVar6 = pCVar3;
      }
      if (pCVar9 != (Curl_addrinfo *)0x0) {
        pCVar9->ai_next = pCVar3;
      }
      iVar1 = he->h_addrtype;
      pCVar3->ai_family = iVar1;
      pCVar3->ai_socktype = 1;
      pCVar3->ai_addrlen = cVar7;
      if (iVar1 == 10) {
        uVar2 = *(undefined8 *)(local_38 + 8);
        *(undefined8 *)(psVar5->sa_data + 6) = *(undefined8 *)local_38;
        psVar5[1].sa_family = (short)uVar2;
        psVar5[1].sa_data[0] = (char)((ulong)uVar2 >> 0x10);
        psVar5[1].sa_data[1] = (char)((ulong)uVar2 >> 0x18);
        psVar5[1].sa_data[2] = (char)((ulong)uVar2 >> 0x20);
        psVar5[1].sa_data[3] = (char)((ulong)uVar2 >> 0x28);
        psVar5[1].sa_data[4] = (char)((ulong)uVar2 >> 0x30);
        psVar5[1].sa_data[5] = (char)((ulong)uVar2 >> 0x38);
LAB_0013a616:
        iVar1 = he->h_addrtype;
        psVar5->sa_family = (sa_family_t)iVar1;
        *(ushort *)psVar5->sa_data = (ushort)port << 8 | (ushort)port >> 8;
      }
      else if (iVar1 == 2) {
        *(undefined4 *)(psVar5->sa_data + 2) = *(undefined4 *)local_38;
        goto LAB_0013a616;
      }
      local_38 = *(char **)((long)he->h_addr_list + lVar8);
      lVar8 = lVar8 + 8;
      pCVar9 = pCVar3;
      if (local_38 == (char *)0x0) {
        return pCVar6;
      }
    }
    (*Curl_cfree)(pCVar3);
joined_r0x0013a65f:
    while (pCVar6 != (Curl_addrinfo *)0x0) {
      (*Curl_cfree)(pCVar6->ai_addr);
      (*Curl_cfree)(pCVar6->ai_canonname);
      pCVar9 = pCVar6->ai_next;
      (*Curl_cfree)(pCVar6);
      pCVar6 = pCVar9;
    }
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

Curl_addrinfo *
Curl_he2ai(const struct hostent *he, int port)
{
  Curl_addrinfo *ai;
  Curl_addrinfo *prevai = NULL;
  Curl_addrinfo *firstai = NULL;
  struct sockaddr_in *addr;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 *addr6;
#endif
  CURLcode result = CURLE_OK;
  int i;
  char *curr;

  if(!he)
    /* no input == no output! */
    return NULL;

  DEBUGASSERT((he->h_name != NULL) && (he->h_addr_list != NULL));

  for(i=0; (curr = he->h_addr_list[i]) != NULL; i++) {

    size_t ss_size;
#ifdef ENABLE_IPV6
    if(he->h_addrtype == AF_INET6)
      ss_size = sizeof (struct sockaddr_in6);
    else
#endif
      ss_size = sizeof (struct sockaddr_in);

    if((ai = calloc(1, sizeof(Curl_addrinfo))) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      break;
    }
    if((ai->ai_canonname = strdup(he->h_name)) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai);
      break;
    }
    if((ai->ai_addr = calloc(1, ss_size)) == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      free(ai->ai_canonname);
      free(ai);
      break;
    }

    if(!firstai)
      /* store the pointer we want to return from this function */
      firstai = ai;

    if(prevai)
      /* make the previous entry point to this */
      prevai->ai_next = ai;

    ai->ai_family = he->h_addrtype;

    /* we return all names as STREAM, so when using this address for TFTP
       the type must be ignored and conn->socktype be used instead! */
    ai->ai_socktype = SOCK_STREAM;

    ai->ai_addrlen = (curl_socklen_t)ss_size;

    /* leave the rest of the struct filled with zero */

    switch (ai->ai_family) {
    case AF_INET:
      addr = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr->sin_addr, curr, sizeof(struct in_addr));
      addr->sin_family = (unsigned short)(he->h_addrtype);
      addr->sin_port = htons((unsigned short)port);
      break;

#ifdef ENABLE_IPV6
    case AF_INET6:
      addr6 = (void *)ai->ai_addr; /* storage area for this info */

      memcpy(&addr6->sin6_addr, curr, sizeof(struct in6_addr));
      addr6->sin6_family = (unsigned short)(he->h_addrtype);
      addr6->sin6_port = htons((unsigned short)port);
      break;
#endif
    }

    prevai = ai;
  }

  if(result) {
    Curl_freeaddrinfo(firstai);
    firstai = NULL;
  }

  return firstai;
}